

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Test(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  uint local_3c;
  int nProcs;
  int nWords;
  int fSwitch;
  int nFrames;
  int fVerbose;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar2 = false;
  nWords = 5;
  bVar1 = false;
  local_3c = 1000;
  Extra_UtilGetoptReset();
LAB_002c791d:
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"WPFsvh");
    if (iVar3 == -1) {
      return 0;
    }
    switch(iVar3) {
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_002c7ab3;
      }
      nWords = atoi(argv[globalUtilOptind]);
      uVar4 = nWords;
      break;
    default:
      goto LAB_002c7ab3;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_002c7ab3;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
        goto LAB_002c7ab3;
      }
      local_3c = atoi(argv[globalUtilOptind]);
      uVar4 = local_3c;
      break;
    case 0x68:
      goto LAB_002c7ab3;
    case 0x73:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_002c791d;
    case 0x76:
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_002c791d;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar4 < 0) {
LAB_002c7ab3:
      Abc_Print(-2,"usage: &test [-FW num] [-svh]\n");
      Abc_Print(-2,"\t        testing various procedures\n");
      Abc_Print(-2,"\t-F num: the number of timeframes [default = %d]\n",(ulong)(uint)nWords);
      Abc_Print(-2,"\t-W num: the number of machine words [default = %d]\n",(ulong)local_3c);
      pcVar5 = "no";
      if (bVar1) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-s    : toggle enable (yes) vs. disable (no) [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (bVar2) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-v    : toggle printing verbose information [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h    : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Test( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fVerbose = 0;
    int nFrames = 5;
    int fSwitch = 0;
    int nWords = 1000;
    int nProcs = 2;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WPFsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nProcs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nProcs < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 's':
            fSwitch ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
//    if ( pAbc->pGia == NULL )
//    {
//        Abc_Print( -1, "Abc_CommandAbc9Test(): There is no AIG.\n" );
//        return 1;
//    }
//    Abc_FrameUpdateGia( pAbc, Abc_Procedure(pAbc->pGia) );
//    Gia_ManTryResub( pAbc->pGia );
    return 0;
usage:
    Abc_Print( -2, "usage: &test [-FW num] [-svh]\n" );
    Abc_Print( -2, "\t        testing various procedures\n" );
    Abc_Print( -2, "\t-F num: the number of timeframes [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-W num: the number of machine words [default = %d]\n", nWords );
    Abc_Print( -2, "\t-s    : toggle enable (yes) vs. disable (no) [default = %s]\n", fSwitch? "yes": "no" );
    Abc_Print( -2, "\t-v    : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}